

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O0

QLatin1StringView language::lookupEnum<7>(EnumLookup (*array) [7],int value,int defaultIndex)

{
  QLatin1StringView QVar1;
  long lVar2;
  char *pcVar3;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  QLatin1StringView defaultValue;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  char local_38 [32];
  QLatin1String local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 0;
  do {
    if (6 < iVar4) {
      lVar2 = in_RDI + (long)in_EDX * 0x18;
      local_18.m_size = *(qsizetype *)(lVar2 + 8);
      local_18.m_data = *(char **)(lVar2 + 0x10);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
      pcVar3 = QLatin1String::data(&local_18);
      QMessageLogger::warning
                (local_38,"uic: Warning: Invalid enumeration value %d, defaulting to %s",
                 (ulong)in_ESI,pcVar3);
LAB_0019664c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QVar1.m_data = local_18.m_data;
        QVar1.m_size = local_18.m_size;
        return QVar1;
      }
      __stack_chk_fail();
    }
    if (in_ESI == *(uint *)(in_RDI + (long)iVar4 * 0x18)) {
      lVar2 = in_RDI + (long)iVar4 * 0x18;
      local_18.m_size = *(qsizetype *)(lVar2 + 8);
      local_18.m_data = *(char **)(lVar2 + 0x10);
      goto LAB_0019664c;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

QLatin1StringView lookupEnum(const EnumLookup(&array)[N], int value, int defaultIndex = 0)
{
    for (int i = 0; i < N; ++i) {
        if (value == array[i].value)
            return array[i].valueString;
    }
    auto defaultValue = array[defaultIndex].valueString;
    qWarning("uic: Warning: Invalid enumeration value %d, defaulting to %s",
             value, defaultValue.data());
    return defaultValue;
}